

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 normalizeRoundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,float_status *status)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint64_t zSig2;
  uint64_t zSig1_00;
  ulong zSig0_00;
  float128 fVar8;
  
  uVar7 = zSig1;
  uVar2 = zSig0;
  if (zSig0 == 0) {
    uVar7 = 0;
    uVar2 = zSig1;
  }
  if (uVar2 == 0) {
    uVar5 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uint)lVar1 ^ 0x3f;
  }
  iVar6 = uVar5 * 0x1000000 + -0xf000000;
  bVar3 = (byte)((uint)iVar6 >> 0x18);
  if (iVar6 >> 0x18 < 0) {
    zSig0_00 = uVar2 >> (-bVar3 & 0x3f);
    zSig1_00 = uVar7 >> (-bVar3 & 0x3f) | uVar2 << (bVar3 & 0x3f);
    zSig2 = uVar7 << (bVar3 & 0x3f);
  }
  else {
    zSig1_00 = uVar7 << (bVar3 & 0x3f);
    if (iVar6 != 0) {
      uVar2 = uVar2 << (bVar3 & 0x3f) | uVar7 >> (-bVar3 & 0x3f);
    }
    zSig2 = 0;
    zSig0_00 = uVar2;
  }
  iVar4 = zExp + -0x40;
  if (zSig0 != 0) {
    iVar4 = zExp;
  }
  fVar8 = roundAndPackFloat128(zSign,iVar4 - (iVar6 >> 0x18),zSig0_00,zSig1_00,zSig2,status);
  return fVar8;
}

Assistant:

static float128 normalizeRoundAndPackFloat128(flag zSign, int32_t zExp,
                                              uint64_t zSig0, uint64_t zSig1,
                                              float_status *status)
{
    int8_t shiftCount;
    uint64_t zSig2;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0) - 15;
    if ( 0 <= shiftCount ) {
        zSig2 = 0;
        shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    }
    else {
        shift128ExtraRightJamming(
            zSig0, zSig1, 0, - shiftCount, &zSig0, &zSig1, &zSig2 );
    }
    zExp -= shiftCount;
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}